

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry_&> __thiscall
kj::
Table<kj::HashMap<capnp::ClientHook*,unsigned_int>::Entry,kj::HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks>>
::find<0ul,capnp::ClientHook*&>
          (Table<kj::HashMap<capnp::ClientHook*,unsigned_int>::Entry,kj::HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks>>
           *this,ClientHook **params)

{
  HashIndex<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Callbacks> *pHVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  Entry *t;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  ArrayPtr<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry> AVar3;
  unsigned_long *pos;
  Entry *local_50;
  ClientHook **local_48;
  Maybe<unsigned_long> local_40;
  undefined1 local_30 [8];
  NullableValue<unsigned_long> _pos583;
  ClientHook **params_local;
  Table<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Callbacks>_>
  *this_local;
  
  _pos583.field_1 = in_RDX;
  pHVar1 = get<0ul,kj::HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks>&>
                     ((HashIndex<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Callbacks> *)
                      (params + 4));
  AVar3 = Vector<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry>::asPtr
                    ((Vector<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry> *)params);
  fwd<capnp::ClientHook*&>((ClientHook **)_pos583.field_1);
  local_50 = AVar3.ptr;
  local_48 = (ClientHook **)AVar3.size_;
  AVar3.size_ = (size_t)local_50;
  AVar3.ptr = (Entry *)pHVar1;
  HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks>::
  find<kj::HashMap<capnp::ClientHook*,unsigned_int>::Entry,capnp::ClientHook*&>
            ((HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks> *)&local_40,AVar3,
             local_48);
  other = kj::_::readMaybe<unsigned_long>(&local_40);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other)
  ;
  Maybe<unsigned_long>::~Maybe(&local_40);
  puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 == (unsigned_long *)0x0) {
    Maybe<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry_&>::Maybe
              ((Maybe<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry_&> *)this);
  }
  else {
    puVar2 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_30);
    t = Vector<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry>::operator[]
                  ((Vector<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry> *)params,*puVar2);
    Maybe<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry_&>::Maybe
              ((Maybe<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry_&> *)this,t);
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return (Maybe<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry_&>)(Entry *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}